

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall ktx::ValidationContext::validateCreateAndTranscode(ValidationContext *this)

{
  bool bVar1;
  _khr_df_model_e _Var2;
  int iVar3;
  char *__s;
  size_t sVar4;
  IssueWarning *issue;
  undefined8 uVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar6;
  string_view fmt;
  format_args args;
  KTXTexture2 texture;
  string local_60;
  long local_40;
  char *local_38 [3];
  
  local_40 = 0;
  iVar3 = (*this->_vptr_ValidationContext[3])(this,(ulong)((uint)this->checkGLTFBasisU * 8 + 1));
  if (this->numWarning == 0 && this->numError == 0) {
    if (iVar3 < 0x13) {
      if (iVar3 != 0) {
        if (iVar3 != 0x11) {
LAB_001aa6e2:
          local_60._M_dataplus._M_p = (pointer)ktxErrorString(iVar3);
          fatal<char_const*>(this,&Validator::CreateFailure,(char **)&local_60);
          goto LAB_001aa813;
        }
        issue = &Validator::UnsupportedFeature;
        goto LAB_001aa6a0;
      }
      bVar1 = (this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_model_e>._M_engaged;
      _Var2 = (this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_model_e>._M_payload._M_value;
      uVar5 = 1;
      if ((bVar1 & _Var2 == KHR_DF_MODEL_ETC1S) == 0) {
        uVar5 = 10;
        if ((bVar1 & _Var2 == KHR_DF_MODEL_UASTC) != 1) goto LAB_001aa813;
      }
      iVar3 = ktxTexture2_TranscodeBasis(local_40,uVar5,0);
      if (iVar3 == 0) goto LAB_001aa813;
      pcVar6 = (char *)(ulong)(this->parsedColorModel).
                              super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
                              super__Optional_payload_base<_khr_df_model_e>._M_payload._M_value;
      __s = (char *)dfdToStringColorModel(pcVar6);
      if (__s == (char *)0x0) {
        fmt.size_ = 2;
        fmt.data_ = (char *)0xa;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)local_38;
        local_38[0] = pcVar6;
        ::fmt::v10::vformat_abi_cxx11_(&local_60,(v10 *)"(0x{:02X})",fmt,args);
      }
      else {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        sVar4 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s,__s + sVar4);
      }
      local_38[0] = (char *)ktxErrorString(iVar3);
      error<std::__cxx11::string,char_const*>(this,&Validator::TranscodeFailure,&local_60,local_38);
    }
    else if (iVar3 == 0x13) {
      toString_abi_cxx11_(&local_60,(ktx *)(ulong)(this->header).supercompressionScheme,
                          KTX_SS_BEGIN_RANGE);
      error<std::__cxx11::string>(this,&LevelIndex::UncompressedByteLengthMismatch,&local_60);
    }
    else {
      if (iVar3 != 0x14) goto LAB_001aa6e2;
      toString_abi_cxx11_(&local_60,(ktx *)(ulong)(this->header).supercompressionScheme,
                          KTX_SS_BEGIN_RANGE);
      error<std::__cxx11::string>(this,&Validator::DecompressChecksumError,&local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (iVar3 != 0 || this->numError == 0) goto LAB_001aa813;
    issue = &Validator::SupportedNonConformantFile;
LAB_001aa6a0:
    warning<>(this,issue);
  }
LAB_001aa813:
  if (local_40 != 0) {
    (*(code *)**(undefined8 **)(local_40 + 8))();
  }
  return;
}

Assistant:

void ValidationContext::validateCreateAndTranscode() {
    KTXTexture2 texture{nullptr};
    ktxTextureCreateFlags flags = KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT;

    if (checkGLTFBasisU)
        flags |= KTX_TEXTURE_CREATE_CHECK_GLTF_BASISU_BIT;

    ktx_error_code_e result = createKTXTexture(flags, texture.pHandle());

    if (numError == 0 && numWarning == 0) {
        switch (result) {
        case KTX_UNSUPPORTED_FEATURE:
            warning(Validator::UnsupportedFeature);
            break;

        case KTX_DECOMPRESS_LENGTH_ERROR:
            error(LevelIndex::UncompressedByteLengthMismatch,
                    toString(ktxSupercmpScheme(header.supercompressionScheme)));
            break;

        case KTX_DECOMPRESS_CHECKSUM_ERROR:
            error(Validator::DecompressChecksumError,
                    toString(ktxSupercmpScheme(header.supercompressionScheme)));
            break;

        case KTX_SUCCESS:
            if (parsedColorModel == KHR_DF_MODEL_ETC1S)
                result = ktxTexture2_TranscodeBasis(texture.handle(), KTX_TTF_ETC2_RGBA, 0);
            else if (parsedColorModel == KHR_DF_MODEL_UASTC)
                result = ktxTexture2_TranscodeBasis(texture.handle(), KTX_TTF_ASTC_4x4_RGBA, 0);

            if (result != KTX_SUCCESS)
                error(Validator::TranscodeFailure, toString(*parsedColorModel), ktxErrorString(result));
            break;

        default:
            fatal(Validator::CreateFailure, ktxErrorString(result));
            break;
        }
    } else if (result == KTX_SUCCESS && numError != 0) {
        warning(Validator::SupportedNonConformantFile);
    }
}